

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Pring *pPVar7;
  int *piVar8;
  Pring *pPVar9;
  pointer pnVar10;
  int *piVar11;
  int32_t iVar12;
  Pring *pPVar13;
  Pring *pPVar14;
  long lVar15;
  Pring *pPVar16;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  pointer pnVar19;
  int iVar20;
  int iVar21;
  int *piVar22;
  long lVar23;
  int *piVar24;
  long lVar25;
  int iVar26;
  int *piVar27;
  byte bVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar28 = 0;
  pPVar13 = (this->temp).pivot_colNZ;
  pPVar14 = pPVar13[1].prev;
  pPVar16 = pPVar13 + 1;
  if (pPVar14 != pPVar16) {
    piVar27 = (this->u).row.start;
    do {
      iVar1 = pPVar14->idx;
      piVar4 = (this->u).col.len;
      iVar2 = piVar4[iVar1];
      piVar4[iVar1] = iVar2 + -1;
      piVar5 = (this->u).col.idx;
      piVar6 = (this->u).col.start;
      iVar2 = piVar5[(long)piVar6[iVar1] + -1 + (long)iVar2];
      pPVar16 = (this->temp).pivot_row;
      pPVar7 = pPVar16[iVar2].next;
      pPVar16 = pPVar16[iVar2].prev;
      pPVar7->prev = pPVar16;
      pPVar16->next = pPVar7;
      piVar8 = (this->u).row.len;
      iVar21 = piVar8[iVar2];
      piVar8[iVar2] = iVar21 + -1;
      lVar25 = (long)piVar27[iVar2] + -1 + (long)iVar21;
      piVar27 = (this->u).row.idx;
      iVar21 = piVar27[lVar25];
      iVar20 = (int)lVar25;
      lVar23 = lVar25;
      if (iVar21 != iVar1) {
        piVar8 = (this->temp).s_cact;
        pPVar16 = (this->temp).pivot_col;
        do {
          iVar20 = piVar6[iVar21];
          iVar3 = piVar4[iVar21];
          iVar26 = piVar8[iVar21];
          piVar8[iVar21] = iVar26 + -1;
          iVar26 = (iVar20 + iVar3) - iVar26;
          piVar11 = piVar5 + iVar26;
          do {
            piVar22 = piVar11;
            piVar11 = piVar22 + 1;
          } while (*piVar22 != iVar2);
          *piVar22 = piVar5[iVar26];
          piVar5[iVar26] = iVar2;
          iVar20 = piVar8[iVar21];
          pPVar7 = pPVar16[iVar21].next;
          pPVar9 = pPVar16[iVar21].prev;
          pPVar7->prev = pPVar9;
          pPVar9->next = pPVar7;
          pPVar7 = pPVar13[iVar20].next;
          pPVar16[iVar21].next = pPVar7;
          pPVar7->prev = pPVar16 + iVar21;
          pPVar16[iVar21].prev = pPVar13 + iVar20;
          pPVar13[iVar20].next = pPVar16 + iVar21;
          iVar21 = piVar27[lVar23 + -1];
          lVar23 = lVar23 + -1;
        } while (iVar21 != iVar1);
        iVar20 = (int)lVar23;
      }
      iVar21 = (this->temp).stage;
      (this->temp).stage = iVar21 + 1;
      pnVar10 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar10 + lVar23;
      pnVar18 = &local_b0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = pnVar10[lVar23].m_backend.exp;
      local_b0.m_backend.neg = pnVar10[lVar23].m_backend.neg;
      local_b0.m_backend.fpclass = pnVar10[lVar23].m_backend.fpclass;
      local_b0.m_backend.prec_elem = pnVar10[lVar23].m_backend.prec_elem;
      setPivot(this,iVar21,iVar1,iVar2,&local_b0);
      piVar27 = (this->u).row.idx;
      piVar27[lVar23] = piVar27[lVar25];
      pnVar10 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar10 + lVar25;
      pnVar19 = pnVar10 + lVar23;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      pnVar10[lVar23].m_backend.exp = pnVar10[lVar25].m_backend.exp;
      pnVar10[lVar23].m_backend.neg = pnVar10[lVar25].m_backend.neg;
      iVar12 = pnVar10[lVar25].m_backend.prec_elem;
      pnVar10[lVar23].m_backend.fpclass = pnVar10[lVar25].m_backend.fpclass;
      pnVar10[lVar23].m_backend.prec_elem = iVar12;
      piVar27 = (this->u).row.start;
      pPVar13 = (this->temp).pivot_colNZ;
      iVar1 = piVar27[iVar2];
      if (iVar1 < iVar20) {
        piVar4 = (this->u).row.idx;
        piVar5 = (this->u).col.idx;
        piVar6 = (this->u).col.len;
        piVar8 = (this->u).col.start;
        piVar11 = (this->temp).s_cact;
        pPVar16 = (this->temp).pivot_col;
        lVar25 = (long)iVar20;
        do {
          iVar21 = piVar4[lVar25 + -1];
          lVar25 = lVar25 + -1;
          iVar20 = piVar8[iVar21];
          iVar3 = piVar6[iVar21];
          iVar26 = piVar11[iVar21];
          piVar11[iVar21] = iVar26 + -1;
          iVar26 = (iVar20 + iVar3) - iVar26;
          piVar22 = piVar5 + iVar26;
          do {
            piVar24 = piVar22;
            piVar22 = piVar24 + 1;
          } while (*piVar24 != iVar2);
          *piVar24 = piVar5[iVar26];
          piVar5[iVar26] = iVar2;
          iVar20 = piVar11[iVar21];
          pPVar7 = pPVar16[iVar21].next;
          pPVar9 = pPVar16[iVar21].prev;
          pPVar7->prev = pPVar9;
          pPVar9->next = pPVar7;
          pPVar7 = pPVar13[iVar20].next;
          pPVar16[iVar21].next = pPVar7;
          pPVar7->prev = pPVar16 + iVar21;
          pPVar16[iVar21].prev = pPVar13 + iVar20;
          pPVar13[iVar20].next = pPVar16 + iVar21;
        } while (iVar1 < lVar25);
      }
      pPVar14 = pPVar14->prev;
      pPVar16 = pPVar13 + 1;
    } while (pPVar14 != pPVar16);
  }
  pPVar13[1].next = pPVar13 + 1;
  pPVar13[1].prev = pPVar16;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}